

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int32 intConst,Instr *instr,Opnd *opnd)

{
  IntConstantToValueMap *pIVar1;
  Type piVar2;
  Sym *sym;
  Opnd *opnd_00;
  bool bVar3;
  uint uVar4;
  Value *pVVar5;
  Value *pVVar6;
  uint uVar7;
  Type this_00;
  uint depth;
  int local_3c;
  Opnd *pOStack_38;
  int32 symStoreIntConstantValue;
  
  pIVar1 = this->intConstantToValueMap;
  piVar2 = pIVar1->buckets;
  depth = 0;
  pOStack_38 = opnd;
  if (piVar2 != (Type)0x0) {
    uVar4 = JsUtil::
            BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(intConst * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar7 = piVar2[uVar4];
    if (-1 < (int)uVar7) {
      depth = 0;
      do {
        if (pIVar1->entries[uVar7].
            super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<int,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
            .super_KeyValueEntryDataLayout2<int,_Value_*>.key == intConst) {
          this_00 = pIVar1->stats;
          goto LAB_00455eac;
        }
        depth = depth + 1;
        uVar7 = pIVar1->entries[uVar7].
                super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<int,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
                .super_KeyValueEntryDataLayout2<int,_Value_*>.next;
      } while (-1 < (int)uVar7);
    }
  }
  this_00 = pIVar1->stats;
  uVar7 = 0xffffffff;
LAB_00455eac:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if ((int)uVar7 < 0) {
    pVVar6 = (Value *)0x0;
  }
  else {
    pVVar6 = pIVar1->entries[uVar7].
             super_DefaultHashedEntry<int,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
             super_KeyValueEntry<int,_Value_*>.
             super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Value_*>_>
             .super_KeyValueEntryDataLayout2<int,_Value_*>.value;
  }
  if ((((pVVar6 == (Value *)0x0) || (sym = pVVar6->valueInfo->symStore, sym == (Sym *)0x0)) ||
      (bVar3 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym), !bVar3)) ||
     ((pVVar5 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym),
      pVVar5 == (Value *)0x0 || (pVVar5->valueNumber != pVVar6->valueNumber)))) {
    pVVar6 = (Value *)0x0;
  }
  else {
    bVar3 = ValueInfo::TryGetIntConstantValue(pVVar5->valueInfo,&local_3c,false);
    pVVar6 = (Value *)0x0;
    if ((bVar3) && (pVVar6 = (Value *)0x0, local_3c == intConst)) {
      pVVar6 = pVVar5;
    }
  }
  opnd_00 = pOStack_38;
  if (pVVar6 == (Value *)0x0) {
    pVVar6 = NewIntConstantValue(this,intConst,instr,true);
  }
  pVVar6 = GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,pVVar6,opnd_00);
  return pVVar6;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int32 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Value *value = nullptr;
    Value *const cachedValue = this->intConstantToValueMap->Lookup(intConst, nullptr);

    if(cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && CurrentBlockData()->IsLive(symStore))
        {

            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            int32 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetIntConstantValue(&symStoreIntConstantValue) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewIntConstantValue(intConst, instr, !Js::TaggedInt::IsOverflow(intConst));
    }

    return CurrentBlockData()->InsertNewValue(value, opnd);
}